

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_mput.c
# Opt level: O3

curls_list * save_curl_handle(curls_list *L,list_node *node)

{
  curls_list *pcVar1;
  curls_list *pcVar2;
  
  if (node != (list_node *)0x0) {
    if (L == (curls_list *)0x0) {
      L = (curls_list *)malloc(0x30);
      L->head = (list_node *)0x0;
      pthread_mutex_init((pthread_mutex_t *)&L->mutex,(pthread_mutexattr_t *)0x0);
    }
    pthread_mutex_lock((pthread_mutex_t *)&L->mutex);
    pcVar2 = L;
    pcVar1 = (curls_list *)L->head;
    if ((curls_list *)L->head != (curls_list *)0x0) {
      do {
        pcVar2 = pcVar1;
        pcVar1 = (curls_list *)pcVar2->head;
      } while ((curls_list *)pcVar2->head != (curls_list *)0x0);
      node->next = (list_node *)0x0;
    }
    pcVar2->head = node;
    pthread_mutex_unlock((pthread_mutex_t *)&L->mutex);
  }
  return L;
}

Assistant:

static struct curls_list*
save_curl_handle(struct curls_list* L, struct list_node* node){
    if(node == NULL){
        return L;
    }
    if(L == NULL){
        L = malloc(sizeof(struct curls_list));
        L->head = NULL;
        pthread_mutex_init(&L->mutex, NULL);
    }
    pthread_mutex_lock(&L->mutex);
    struct list_node *h = L->head;
    if(h == NULL){
        L->head = node;
    }else{
        struct list_node *n=h;
        while(n->next != NULL){
            n=n->next;
        }
        node->next = n->next;
        n->next = node;
    }
    pthread_mutex_unlock(&L->mutex);
    return L;
}